

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O0

Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *
wasm::WATParser::anon_unknown_22::action
          (Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
           *__return_storage_ptr__,Lexer *in)

{
  bool bVar1;
  variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction> *u;
  allocator<char> local_179;
  string local_178;
  Err local_158;
  uint local_134;
  Err local_130;
  Err *local_110;
  Err *err;
  undefined1 local_f8 [8];
  MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> _val;
  MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> a;
  Lexer *in_local;
  
  maybeAction((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
               *)((long)&_val.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 + 0x68),in);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool
                    ((MaybeResult *)
                     ((long)&_val.val.
                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     + 0x68));
  if (bVar1) {
    MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
    MaybeResult((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                 *)local_f8,
                (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                 *)((long)&_val.val.
                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                   + 0x68));
    local_110 = MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                ::getErr((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                          *)local_f8);
    bVar1 = local_110 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_130,local_110);
      Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::Result
                (__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    local_134 = (uint)bVar1;
    MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
    ~MaybeResult((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                  *)local_f8);
    if (local_134 == 0) {
      u = MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
          operator*((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                     *)((long)&_val.val.
                               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               .
                               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       + 0x68));
      Result<std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>>::
      Result<std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>&>
                ((Result<std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>> *)
                 __return_storage_ptr__,u);
      local_134 = 1;
    }
  }
  else {
    local_134 = 0;
  }
  MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
  ~MaybeResult((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                *)((long)&_val.val.
                          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                  + 0x68));
  if (local_134 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"expected action",&local_179);
    Lexer::err(&local_158,in,&local_178);
    Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::Result
              (__return_storage_ptr__,&local_158);
    wasm::Err::~Err(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Action> action(Lexer& in) {
  if (auto a = maybeAction(in)) {
    CHECK_ERR(a);
    return *a;
  }
  return in.err("expected action");
}